

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_test.cc
# Opt level: O1

void logger_worker(WorkerArgs *args)

{
  SimpleLogger *this;
  Timer *pTVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  size_t line_number;
  double dVar6;
  
  this = args->ll;
  pTVar1 = args->tt;
  do {
    uVar2 = rand();
    uVar2 = uVar2 & 0xffffff;
    iVar5 = 1;
    if (((0xf < uVar2) && (iVar5 = 2, 0x1f < uVar2)) && (iVar5 = 3, 0x7f < uVar2)) {
      iVar5 = 5 - (uint)(uVar2 < 0x200);
    }
    switch(iVar5) {
    case 1:
      if ((this != (SimpleLogger *)0x0) && (0 < (this->curLogLevel).super___atomic_base<int>._M_i))
      {
        lVar3 = std::chrono::_V2::system_clock::now();
        dVar6 = ((double)(lVar3 - (pTVar1->start).__d.__r) / 1000000000.0) * 1000000.0;
        uVar4 = (ulong)dVar6;
        uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
        line_number = 0x3a;
        iVar5 = 1;
LAB_001051b8:
        SimpleLogger::put(this,iVar5,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/tests/logger_test.cc"
                          ,"logger_worker",line_number,"%ld",uVar4);
      }
      break;
    case 2:
      if ((this != (SimpleLogger *)0x0) && (1 < (this->curLogLevel).super___atomic_base<int>._M_i))
      {
        lVar3 = std::chrono::_V2::system_clock::now();
        dVar6 = ((double)(lVar3 - (pTVar1->start).__d.__r) / 1000000000.0) * 1000000.0;
        uVar4 = (ulong)dVar6;
        uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
        line_number = 0x3c;
        iVar5 = 2;
        goto LAB_001051b8;
      }
      break;
    case 3:
      if ((this != (SimpleLogger *)0x0) && (2 < (this->curLogLevel).super___atomic_base<int>._M_i))
      {
        lVar3 = std::chrono::_V2::system_clock::now();
        dVar6 = ((double)(lVar3 - (pTVar1->start).__d.__r) / 1000000000.0) * 1000000.0;
        uVar4 = (ulong)dVar6;
        uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
        line_number = 0x3e;
        iVar5 = 3;
        goto LAB_001051b8;
      }
      break;
    case 4:
      if ((this != (SimpleLogger *)0x0) && (3 < (this->curLogLevel).super___atomic_base<int>._M_i))
      {
        lVar3 = std::chrono::_V2::system_clock::now();
        dVar6 = ((double)(lVar3 - (pTVar1->start).__d.__r) / 1000000000.0) * 1000000.0;
        uVar4 = (ulong)dVar6;
        uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
        line_number = 0x40;
        iVar5 = 4;
        goto LAB_001051b8;
      }
      break;
    default:
      if ((iVar5 == 5 && this != (SimpleLogger *)0x0) &&
         (4 < (this->curLogLevel).super___atomic_base<int>._M_i)) {
        lVar3 = std::chrono::_V2::system_clock::now();
        dVar6 = ((double)(lVar3 - (pTVar1->start).__d.__r) / 1000000000.0) * 1000000.0;
        uVar4 = (ulong)dVar6;
        uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
        line_number = 0x42;
        iVar5 = 5;
        goto LAB_001051b8;
      }
    }
    lVar3 = std::chrono::_V2::system_clock::now();
    if (((double)CONCAT44(0x45300000,(int)(pTVar1->duration_ms >> 0x20)) - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)pTVar1->duration_ms) - 4503599627370496.0) <
        ((double)(lVar3 - (pTVar1->start).__d.__r) / 1000000000.0) * 1000.0) {
      return;
    }
  } while( true );
}

Assistant:

void logger_worker(WorkerArgs* args) {
    SimpleLogger* ll = args->ll;
    TestSuite::Timer& tt = *args->tt;
    do {
        int level = get_random_level();
        if (level == 1) {
            _log_fatal(ll, "%ld", tt.getTimeUs());
        } else if (level == 2) {
            _log_err(ll, "%ld", tt.getTimeUs());
        } else if (level == 3) {
            _log_warn(ll, "%ld", tt.getTimeUs());
        } else if (level == 4) {
            _log_info(ll, "%ld", tt.getTimeUs());
        } else if (level == 5) {
            _log_debug(ll, "%ld", tt.getTimeUs());
        }
    } while(!tt.timeover());
}